

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool createNativeWindow(_GLFWwindow *window,_GLFWwndconfig *wndconfig,Visual *visual,int depth)

{
  GLFWbool GVar1;
  __pid_t _Var2;
  Colormap CVar3;
  Window WVar4;
  XWMHints *pXVar5;
  XClassHint *pXVar6;
  size_t sVar7;
  char *__s;
  int in_ECX;
  int iVar8;
  Visual *in_RDX;
  uint *in_RSI;
  char *in_RDI;
  Atom version;
  char *resourceName;
  XClassHint *hint;
  XWMHints *hints;
  Atom type;
  long pid;
  Atom protocols [2];
  int count;
  Atom states [3];
  XSetWindowAttributes wa;
  int height;
  int width;
  char *in_stack_000002b8;
  int in_stack_000002c4;
  Atom *pAVar9;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int *xpos;
  _GLFWwindow *window_00;
  uchar local_118 [4];
  GLFWbool enabled;
  _GLFWwindow *in_stack_fffffffffffffef0;
  Atom local_f8;
  Atom local_f0;
  Atom local_e8;
  Atom local_e0;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  Atom local_c8;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  _GLFWwindow *in_stack_ffffffffffffff50;
  _GLFWwindow *in_stack_ffffffffffffff78;
  uint local_34;
  uint local_30;
  GLFWbool local_c;
  
  enabled = (GLFWbool)((ulong)_local_118 >> 0x20);
  local_30 = *in_RSI;
  local_34 = in_RSI[1];
  if (in_RSI[0xe] != 0) {
    local_30 = (uint)((float)(int)local_30 * _glfw.x11.contentScaleX);
    local_34 = (uint)((float)(int)local_34 * _glfw.x11.contentScaleY);
  }
  CVar3 = (*_glfw.x11.xlib.CreateColormap)(_glfw.x11.display,_glfw.x11.root,in_RDX,0);
  *(Colormap *)(in_RDI + 0x348) = CVar3;
  GVar1 = _glfwIsVisualTransparentX11
                    ((Visual *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  *(GLFWbool *)(in_RDI + 0x374) = GVar1;
  memset(&stack0xffffffffffffff58,0,0x70);
  _glfwGrabErrorHandlerX11();
  *(Window *)(in_RDI + 0x358) = _glfw.x11.root;
  window_00 = (_GLFWwindow *)&stack0xffffffffffffff58;
  xpos = (int *)0x2808;
  WVar4 = (*_glfw.x11.xlib.CreateWindow)
                    (_glfw.x11.display,_glfw.x11.root,0,0,local_30,local_34,0,in_ECX,1,in_RDX,0x2808
                     ,(XSetWindowAttributes *)window_00);
  *(Window *)(in_RDI + 0x350) = WVar4;
  _glfwReleaseErrorHandlerX11();
  if (*(long *)(in_RDI + 0x350) == 0) {
    _glfwInputErrorX11(in_stack_000002c4,in_stack_000002b8);
    local_c = 0;
  }
  else {
    (*_glfw.x11.xlib.SaveContext)
              (_glfw.x11.display,*(XID *)(in_RDI + 0x350),_glfw.x11.context,in_RDI);
    if (in_RSI[6] == 0) {
      _glfwPlatformSetWindowDecorated(in_stack_fffffffffffffef0,enabled);
    }
    if ((_glfw.x11.NET_WM_STATE != 0) && (*(long *)(in_RDI + 0x48) == 0)) {
      in_stack_ffffffffffffff34 = 0;
      if (in_RSI[9] != 0) {
        if (_glfw.x11.NET_WM_STATE_ABOVE != 0) {
          local_c8 = _glfw.x11.NET_WM_STATE_ABOVE;
        }
        in_stack_ffffffffffffff34 = (uint)(_glfw.x11.NET_WM_STATE_ABOVE != 0);
      }
      if (((in_RSI[10] != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
         (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
        iVar8 = in_stack_ffffffffffffff34 + 1;
        (&local_c8)[(int)in_stack_ffffffffffffff34] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + 2;
        (&local_c8)[iVar8] = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        in_RDI[0x370] = '\x01';
        in_RDI[0x371] = '\0';
        in_RDI[0x372] = '\0';
        in_RDI[0x373] = '\0';
      }
      if (in_stack_ffffffffffffff34 != 0) {
        (*_glfw.x11.xlib.ChangeProperty)
                  (_glfw.x11.display,*(Window *)(in_RDI + 0x350),_glfw.x11.NET_WM_STATE,4,0x20,0,
                   (uchar *)&local_c8,in_stack_ffffffffffffff34);
      }
    }
    local_e8 = _glfw.x11.WM_DELETE_WINDOW;
    local_e0 = _glfw.x11.NET_WM_PING;
    (*_glfw.x11.xlib.SetWMProtocols)(_glfw.x11.display,*(Window *)(in_RDI + 0x350),&local_e8,2);
    _Var2 = getpid();
    local_f0 = (Atom)_Var2;
    pAVar9 = &local_f0;
    uVar10 = 1;
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,*(Window *)(in_RDI + 0x350),_glfw.x11.NET_WM_PID,6,0x20,0,
               (uchar *)pAVar9,1);
    if ((_glfw.x11.NET_WM_WINDOW_TYPE != 0) && (_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL != 0)) {
      local_f8 = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
      pAVar9 = &local_f8;
      uVar10 = 1;
      (*_glfw.x11.xlib.ChangeProperty)
                (_glfw.x11.display,*(Window *)(in_RDI + 0x350),_glfw.x11.NET_WM_WINDOW_TYPE,4,0x20,0
                 ,(uchar *)pAVar9,1);
    }
    pXVar5 = (*_glfw.x11.xlib.AllocWMHints)();
    if (pXVar5 == (XWMHints *)0x0) {
      _glfwInputError(0x10005,"X11: Failed to allocate WM hints");
      local_c = 0;
    }
    else {
      pXVar5->flags = 2;
      pXVar5->initial_state = 1;
      (*_glfw.x11.xlib.SetWMHints)(_glfw.x11.display,*(Window *)(in_RDI + 0x350),pXVar5);
      (*_glfw.x11.xlib.Free)(pXVar5);
      updateNormalHints((_GLFWwindow *)CONCAT44(in_stack_fffffffffffffec4,uVar10),
                        (int)((ulong)pAVar9 >> 0x20),(int)pAVar9);
      pXVar6 = (*_glfw.x11.xlib.AllocClassHint)();
      sVar7 = strlen((char *)(in_RSI + 0x90));
      if ((sVar7 == 0) || (sVar7 = strlen((char *)(in_RSI + 0x50)), sVar7 == 0)) {
        __s = getenv("RESOURCE_NAME");
        if ((__s == (char *)0x0) || (sVar7 = strlen(__s), sVar7 == 0)) {
          sVar7 = strlen(*(char **)(in_RSI + 2));
          if (sVar7 == 0) {
            pXVar6->res_name = "glfw-application";
          }
          else {
            pXVar6->res_name = *(char **)(in_RSI + 2);
          }
        }
        else {
          pXVar6->res_name = __s;
        }
        sVar7 = strlen(*(char **)(in_RSI + 2));
        if (sVar7 == 0) {
          pXVar6->res_class = "GLFW-Application";
        }
        else {
          pXVar6->res_class = *(char **)(in_RSI + 2);
        }
      }
      else {
        pXVar6->res_name = (char *)(in_RSI + 0x90);
        pXVar6->res_class = (char *)(in_RSI + 0x50);
      }
      (*_glfw.x11.xlib.SetClassHint)(_glfw.x11.display,*(Window *)(in_RDI + 0x350),pXVar6);
      (*_glfw.x11.xlib.Free)(pXVar6);
      _local_118 = 5;
      (*_glfw.x11.xlib.ChangeProperty)
                (_glfw.x11.display,*(Window *)(in_RDI + 0x350),_glfw.x11.XdndAware,4,0x20,0,
                 local_118,1);
      if (_glfw.x11.im != (XIM)0x0) {
        _glfwCreateInputContextX11(in_stack_ffffffffffffff78);
      }
      _glfwPlatformSetWindowTitle
                ((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      _glfwPlatformGetWindowPos(window_00,xpos,(int *)in_RDX);
      _glfwPlatformGetWindowSize
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_c = 1;
    }
  }
  return local_c;
}

Assistant:

static GLFWbool createNativeWindow(_GLFWwindow* window,
                                   const _GLFWwndconfig* wndconfig,
                                   Visual* visual, int depth)
{
    int width = wndconfig->width;
    int height = wndconfig->height;

    if (wndconfig->scaleToMonitor)
    {
        width *= _glfw.x11.contentScaleX;
        height *= _glfw.x11.contentScaleY;
    }

    // Create a colormap based on the visual used by the current context
    window->x11.colormap = XCreateColormap(_glfw.x11.display,
                                           _glfw.x11.root,
                                           visual,
                                           AllocNone);

    window->x11.transparent = _glfwIsVisualTransparentX11(visual);

    XSetWindowAttributes wa = { 0 };
    wa.colormap = window->x11.colormap;
    wa.event_mask = StructureNotifyMask | KeyPressMask | KeyReleaseMask |
                    PointerMotionMask | ButtonPressMask | ButtonReleaseMask |
                    ExposureMask | FocusChangeMask | VisibilityChangeMask |
                    EnterWindowMask | LeaveWindowMask | PropertyChangeMask;

    _glfwGrabErrorHandlerX11();

    window->x11.parent = _glfw.x11.root;
    window->x11.handle = XCreateWindow(_glfw.x11.display,
                                       _glfw.x11.root,
                                       0, 0,   // Position
                                       width, height,
                                       0,      // Border width
                                       depth,  // Color depth
                                       InputOutput,
                                       visual,
                                       CWBorderPixel | CWColormap | CWEventMask,
                                       &wa);

    _glfwReleaseErrorHandlerX11();

    if (!window->x11.handle)
    {
        _glfwInputErrorX11(GLFW_PLATFORM_ERROR,
                           "X11: Failed to create window");
        return GLFW_FALSE;
    }

    XSaveContext(_glfw.x11.display,
                 window->x11.handle,
                 _glfw.x11.context,
                 (XPointer) window);

    if (!wndconfig->decorated)
        _glfwPlatformSetWindowDecorated(window, GLFW_FALSE);

    if (_glfw.x11.NET_WM_STATE && !window->monitor)
    {
        Atom states[3];
        int count = 0;

        if (wndconfig->floating)
        {
            if (_glfw.x11.NET_WM_STATE_ABOVE)
                states[count++] = _glfw.x11.NET_WM_STATE_ABOVE;
        }

        if (wndconfig->maximized)
        {
            if (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT &&
                _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ)
            {
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
                window->x11.maximized = GLFW_TRUE;
            }
        }

        if (count)
        {
            XChangeProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_STATE, XA_ATOM, 32,
                            PropModeReplace, (unsigned char*) states, count);
        }
    }

    // Declare the WM protocols supported by GLFW
    {
        Atom protocols[] =
        {
            _glfw.x11.WM_DELETE_WINDOW,
            _glfw.x11.NET_WM_PING
        };

        XSetWMProtocols(_glfw.x11.display, window->x11.handle,
                        protocols, sizeof(protocols) / sizeof(Atom));
    }

    // Declare our PID
    {
        const long pid = getpid();

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_PID, XA_CARDINAL, 32,
                        PropModeReplace,
                        (unsigned char*) &pid, 1);
    }

    if (_glfw.x11.NET_WM_WINDOW_TYPE && _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL)
    {
        Atom type = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_WINDOW_TYPE, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &type, 1);
    }

    // Set ICCCM WM_HINTS property
    {
        XWMHints* hints = XAllocWMHints();
        if (!hints)
        {
            _glfwInputError(GLFW_OUT_OF_MEMORY,
                            "X11: Failed to allocate WM hints");
            return GLFW_FALSE;
        }

        hints->flags = StateHint;
        hints->initial_state = NormalState;

        XSetWMHints(_glfw.x11.display, window->x11.handle, hints);
        XFree(hints);
    }

    updateNormalHints(window, width, height);

    // Set ICCCM WM_CLASS property
    {
        XClassHint* hint = XAllocClassHint();

        if (strlen(wndconfig->x11.instanceName) &&
            strlen(wndconfig->x11.className))
        {
            hint->res_name = (char*) wndconfig->x11.instanceName;
            hint->res_class = (char*) wndconfig->x11.className;
        }
        else
        {
            const char* resourceName = getenv("RESOURCE_NAME");
            if (resourceName && strlen(resourceName))
                hint->res_name = (char*) resourceName;
            else if (strlen(wndconfig->title))
                hint->res_name = (char*) wndconfig->title;
            else
                hint->res_name = (char*) "glfw-application";

            if (strlen(wndconfig->title))
                hint->res_class = (char*) wndconfig->title;
            else
                hint->res_class = (char*) "GLFW-Application";
        }

        XSetClassHint(_glfw.x11.display, window->x11.handle, hint);
        XFree(hint);
    }

    // Announce support for Xdnd (drag and drop)
    {
        const Atom version = _GLFW_XDND_VERSION;
        XChangeProperty(_glfw.x11.display, window->x11.handle,
                        _glfw.x11.XdndAware, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &version, 1);
    }

    if (_glfw.x11.im)
        _glfwCreateInputContextX11(window);

    _glfwPlatformSetWindowTitle(window, wndconfig->title);
    _glfwPlatformGetWindowPos(window, &window->x11.xpos, &window->x11.ypos);
    _glfwPlatformGetWindowSize(window, &window->x11.width, &window->x11.height);

    return GLFW_TRUE;
}